

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O2

void ZSTD_fillHashTable(ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm)

{
  U32 hBits;
  U32 mls;
  U32 *pUVar1;
  BYTE *pBVar2;
  size_t sVar3;
  ulong uVar4;
  BYTE *p_00;
  U32 p;
  long lVar5;
  int local_48;
  
  pUVar1 = ms->hashTable;
  hBits = (ms->cParams).hashLog;
  mls = (ms->cParams).minMatch;
  pBVar2 = (ms->window).base;
  uVar4 = (ulong)ms->nextToUpdate;
  p_00 = pBVar2 + uVar4;
  while (p_00 + 3 < (BYTE *)((long)end - 6U)) {
    local_48 = (int)pBVar2;
    sVar3 = ZSTD_hashPtr(p_00,hBits,mls);
    pUVar1[sVar3] = (int)p_00 - local_48;
    if (dtlm != ZSTD_dtlm_fast) {
      for (lVar5 = 1; lVar5 != 3; lVar5 = lVar5 + 1) {
        sVar3 = ZSTD_hashPtr(p_00 + lVar5,hBits,mls);
        if (pUVar1[sVar3] == 0) {
          pUVar1[sVar3] = (int)uVar4 + (int)lVar5;
        }
      }
    }
    uVar4 = uVar4 + 3;
    p_00 = p_00 + 3;
  }
  return;
}

Assistant:

void ZSTD_fillHashTable(ZSTD_matchState_t* ms,
                        void const* end, ZSTD_dictTableLoadMethod_e dtlm)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32  const hBits = cParams->hashLog;
    U32  const mls = cParams->minMatch;
    const BYTE* const base = ms->window.base;
    const BYTE* ip = base + ms->nextToUpdate;
    const BYTE* const iend = ((const BYTE*)end) - HASH_READ_SIZE;
    const U32 fastHashFillStep = 3;

    /* Always insert every fastHashFillStep position into the hash table.
     * Insert the other positions if their hash entry is empty.
     */
    for ( ; ip + fastHashFillStep < iend + 2; ip += fastHashFillStep) {
        U32 const current = (U32)(ip - base);
        size_t const hash0 = ZSTD_hashPtr(ip, hBits, mls);
        hashTable[hash0] = current;
        if (dtlm == ZSTD_dtlm_fast) continue;
        /* Only load extra positions for ZSTD_dtlm_full */
        {   U32 p;
            for (p = 1; p < fastHashFillStep; ++p) {
                size_t const hash = ZSTD_hashPtr(ip + p, hBits, mls);
                if (hashTable[hash] == 0) {  /* not yet filled */
                    hashTable[hash] = current + p;
    }   }   }   }
}